

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVector.hpp
# Opt level: O1

void deqp::gles3::Functional::MatrixCaseUtils::Evaluator<6,_5,_94>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  float *pfVar1;
  Vector<float,_2> *pVVar2;
  long lVar3;
  undefined4 *puVar4;
  long lVar5;
  bool bVar6;
  undefined4 uVar7;
  Matrix<float,_2,_2> res;
  float local_34 [3];
  Type in0;
  Vec4 *local_18;
  int local_10 [4];
  
  pfVar1 = (float *)&in0;
  if (in0Type == INPUTTYPE_DYNAMIC) {
    lVar3 = 0;
    do {
      lVar5 = 0;
      do {
        uVar7 = 0x3f800000;
        if (lVar3 != lVar5) {
          uVar7 = 0;
        }
        pfVar1[lVar5 * 2] = (float)uVar7;
        lVar5 = lVar5 + 1;
      } while (lVar5 == 1);
      pfVar1 = pfVar1 + 1;
      bVar6 = lVar3 == 0;
      lVar3 = lVar3 + 1;
    } while (bVar6);
    in0.m_data.m_data[0].m_data = *(float (*) [2])evalCtx->in[0].m_data;
    in0.m_data.m_data[1].m_data = *(float (*) [2])evalCtx->in[1].m_data;
  }
  else {
    in0.m_data.m_data[0].m_data[0] = 0.0;
    in0.m_data.m_data[0].m_data[1] = 0.0;
    in0.m_data.m_data[1].m_data[0] = 0.0;
    in0.m_data.m_data[1].m_data[1] = 0.0;
    puVar4 = &s_constInMat2x2;
    lVar3 = 0;
    do {
      lVar5 = 0;
      do {
        pfVar1[lVar5 * 2] = (float)puVar4[lVar5];
        lVar5 = lVar5 + 1;
      } while (lVar5 == 1);
      pfVar1 = pfVar1 + 1;
      puVar4 = puVar4 + 2;
      bVar6 = lVar3 == 0;
      lVar3 = lVar3 + 1;
    } while (bVar6);
  }
  pfVar1 = (float *)&res;
  lVar3 = 0;
  do {
    lVar5 = 0;
    do {
      uVar7 = 0x3f800000;
      if (lVar3 != lVar5) {
        uVar7 = 0;
      }
      pfVar1[lVar5 * 2] = (float)uVar7;
      lVar5 = lVar5 + 1;
    } while (lVar5 == 1);
    pfVar1 = pfVar1 + 1;
    bVar6 = lVar3 == 0;
    lVar3 = lVar3 + 1;
  } while (bVar6);
  pVVar2 = (Vector<float,_2> *)&res;
  pfVar1 = (float *)&in0;
  lVar3 = 0;
  do {
    lVar5 = 0;
    do {
      ((Vector<tcu::Vector<float,_2>,_2> *)pVVar2->m_data)->m_data[0].m_data[lVar5] =
           pfVar1[lVar5 * 2];
      lVar5 = lVar5 + 1;
    } while (lVar5 == 1);
    pVVar2 = pVVar2 + 1;
    pfVar1 = pfVar1 + 1;
    bVar6 = lVar3 == 0;
    lVar3 = lVar3 + 1;
  } while (bVar6);
  local_18 = &evalCtx->color;
  local_10[0] = 0;
  local_10[1] = 1;
  local_10[2] = 2;
  lVar3 = 2;
  do {
    (evalCtx->color).m_data[*(int *)((long)&local_18 + lVar3 * 4)] =
         res.m_data.m_data[1].m_data[lVar3 + 1];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 5);
  return;
}

Assistant:

inline Vector<T, Size>::Vector (void)
{
	for (int i = 0; i < Size; i++)
		m_data[i] = T();
}